

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

int __thiscall
ON_NurbsSurface::GetNurbForm(ON_NurbsSurface *this,ON_NurbsSurface *srf,double param_2)

{
  double param_2_local;
  ON_NurbsSurface *srf_local;
  ON_NurbsSurface *this_local;
  
  ON_NurbsSurfaceCopyHelper(this,srf);
  return 1;
}

Assistant:

int ON_NurbsSurface::GetNurbForm(
      ON_NurbsSurface& srf,
      double // tolerance
      ) const
{
  // 4 May 2007 Dale Lear
  //   I'm replacing the call to operator= with a call to
  //   ON_NurbsSurfaceCopyHelper().  The operator= call
  //   was copying userdata and that does not happen for
  //   any other GetNurbForm overrides.  Copying userdata
  //   in GetNurbForm is causing trouble in Make2D and 
  //   other places that are creating NURBS copies in
  //   worker memory pools.

  //srf = *this; // copied user data
  ON_NurbsSurfaceCopyHelper(*this,srf); // does not copy user data
  return 1;
}